

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
::Chain_matrix(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
               *this,Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
                     *matrixToCopy,Column_settings *colSettings)

{
  size_type sVar1;
  double dVar2;
  size_t sVar3;
  undefined4 uVar4;
  __hashtable *__this;
  __node_base *p_Var5;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_unsigned_int>,_false>_>_>
  local_30;
  
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)this,(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)matrixToCopy);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&(this->super_Chain_representative_cycles_option).birthToCycle_,
             &(matrixToCopy->super_Chain_representative_cycles_option).birthToCycle_);
  (this->matrix_)._M_h._M_buckets = &(this->matrix_)._M_h._M_single_bucket;
  (this->matrix_)._M_h._M_bucket_count = 1;
  (this->matrix_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->matrix_)._M_h._M_element_count = 0;
  (this->matrix_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_30._M_h = (__hashtable_alloc *)&this->pivotToColumnIndex_;
  (this->matrix_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->matrix_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pivotToColumnIndex_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->pivotToColumnIndex_)._M_h._M_bucket_count =
       (matrixToCopy->pivotToColumnIndex_)._M_h._M_bucket_count;
  (this->pivotToColumnIndex_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pivotToColumnIndex_)._M_h._M_element_count =
       (matrixToCopy->pivotToColumnIndex_)._M_h._M_element_count;
  uVar4 = *(undefined4 *)&(matrixToCopy->pivotToColumnIndex_)._M_h._M_rehash_policy.field_0x4;
  sVar3 = (matrixToCopy->pivotToColumnIndex_)._M_h._M_rehash_policy._M_next_resize;
  (this->pivotToColumnIndex_)._M_h._M_rehash_policy._M_max_load_factor =
       (matrixToCopy->pivotToColumnIndex_)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->pivotToColumnIndex_)._M_h._M_rehash_policy.field_0x4 = uVar4;
  (this->pivotToColumnIndex_)._M_h._M_rehash_policy._M_next_resize = sVar3;
  (this->pivotToColumnIndex_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,unsigned_int>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_30._M_h,&(matrixToCopy->pivotToColumnIndex_)._M_h,&local_30);
  this->nextIndex_ = matrixToCopy->nextIndex_;
  if (colSettings == (Column_settings *)0x0) {
    colSettings = matrixToCopy->colSettings_;
  }
  this->colSettings_ = colSettings;
  sVar1 = (matrixToCopy->matrix_)._M_h._M_element_count;
  dVar2 = ceil((((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
               (double)(this->matrix_)._M_h._M_rehash_policy._M_max_load_factor);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->matrix_)._M_h,
           (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2);
  p_Var5 = &(matrixToCopy->matrix_)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    _container_insert(this,(Column *)(p_Var5 + 2),(Index)*(size_type *)(p_Var5 + 1));
  }
  return;
}

Assistant:

inline Chain_matrix<Master_matrix>::Chain_matrix(const Chain_matrix& matrixToCopy, Column_settings* colSettings)
    : Dim_opt(static_cast<const Dim_opt&>(matrixToCopy)),
      Pair_opt(static_cast<const Pair_opt&>(matrixToCopy)),
      Swap_opt(static_cast<const Swap_opt&>(matrixToCopy)),
      Rep_opt(static_cast<const Rep_opt&>(matrixToCopy)),
      RA_opt(static_cast<const RA_opt&>(matrixToCopy)),
      pivotToColumnIndex_(matrixToCopy.pivotToColumnIndex_),
      nextIndex_(matrixToCopy.nextIndex_),
      colSettings_(colSettings == nullptr ? matrixToCopy.colSettings_ : colSettings)
{
  matrix_.reserve(matrixToCopy.matrix_.size());
  for (const auto& cont : matrixToCopy.matrix_){
    if constexpr (Master_matrix::Option_list::has_map_column_container){
      _container_insert(cont.second, cont.first);
    } else {
      _container_insert(cont);
    }
  }
}